

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateProgramInputBlockContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               deUint32 presentShadersMask,bool includeEmpty,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *genCase)

{
  deInt32 *pdVar1;
  int iVar2;
  NodeType NVar3;
  ShaderType SVar4;
  Node *pNVar5;
  SharedPtrStateBase *pSVar6;
  Node *pNVar7;
  SharedPtr variable_1;
  SharedPtr variable_4;
  SharedPtr variable;
  SharedPtr local_88;
  SharedPtr local_78;
  SharedPtr local_68;
  Context *local_58;
  TestCaseGroup *local_50;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr *local_48;
  Node *local_40;
  SharedPtrStateBase *local_38;
  
  local_40 = parentStructure->m_ptr;
  NVar3 = local_40->m_type;
  local_58 = context;
  local_50 = targetGroup;
  local_48 = genCase;
  if (NVar3 == TYPE_DEFAULT_BLOCK) {
    pNVar5 = (Node *)operator_new(0x28);
    pSVar6 = parentStructure->m_state;
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
    (pNVar5->m_enclosingNode).m_ptr = local_40;
    (pNVar5->m_enclosingNode).m_state = pSVar6;
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0;
    local_40 = pNVar5;
    local_38 = (SharedPtrStateBase *)operator_new(0x20);
    local_38->strongRefCount = 0;
    local_38->weakRefCount = 0;
    local_38->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_38[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    local_38->strongRefCount = 1;
    local_38->weakRefCount = 1;
    SVar4 = getShaderMaskFirstStage(presentShadersMask);
    if (includeEmpty) {
      (*local_48)(local_58,parentStructure,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"empty");
    }
  }
  else {
    local_38 = parentStructure->m_state;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_38->weakRefCount = local_38->weakRefCount + 1;
      UNLOCK();
    }
    SVar4 = getShaderMaskFirstStage(presentShadersMask);
  }
  if (SVar4 == SHADERTYPE_FRAGMENT) {
LAB_01574ded:
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_40;
    (pNVar5->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_78,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_78.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x20);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_STRUCT_MEMBER;
    (pNVar5->m_enclosingNode).m_ptr = local_40;
    (pNVar5->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar5;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar7;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var_struct");
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pSVar6 = local_78.m_state;
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_78.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_78.m_ptr = (Node *)0x0;
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
      }
      LOCK();
      pdVar1 = &pSVar6->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_ARRAY_ELEMENT;
    (pNVar5->m_enclosingNode).m_ptr = local_40;
    (pNVar5->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
    local_78.m_state = (SharedPtrStateBase *)0x0;
    local_78.m_ptr = pNVar5;
    pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
    pSVar6->strongRefCount = 0;
    pSVar6->weakRefCount = 0;
    pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    pSVar6->strongRefCount = 1;
    pSVar6->weakRefCount = 1;
    local_78.m_state = pSVar6;
    pNVar7 = (Node *)operator_new(0x28);
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar7->m_type = TYPE_VARIABLE;
    (pNVar7->m_enclosingNode).m_ptr = pNVar5;
    (pNVar7->m_enclosingNode).m_state = pSVar6;
    LOCK();
    pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
    local_88.m_state = (SharedPtrStateBase *)0x0;
    local_88.m_ptr = pNVar7;
    local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_88.m_state)->strongRefCount = 0;
    (local_88.m_state)->weakRefCount = 0;
    (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
    (local_88.m_state)->strongRefCount = 1;
    (local_88.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var_array");
LAB_0157518b:
    if (local_88.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_88.m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_88.m_ptr = (Node *)0x0;
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_88.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      iVar2 = *pdVar1;
      UNLOCK();
joined_r0x015751b7:
      if ((iVar2 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
LAB_015751c9:
    pSVar6 = local_78.m_state;
    if (local_78.m_state == (SharedPtrStateBase *)0x0) goto LAB_01575206;
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])(local_78.m_state);
    }
    LOCK();
    pdVar1 = &pSVar6->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    iVar2 = *pdVar1;
    UNLOCK();
  }
  else {
    if (SVar4 != SHADERTYPE_VERTEX) {
      if (NVar3 != TYPE_DEFAULT_BLOCK) goto LAB_01574ded;
      if ((SVar4 & ~SHADERTYPE_FRAGMENT) == SHADERTYPE_GEOMETRY) {
        pNVar5 = (Node *)operator_new(0x28);
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
        pNVar5->m_type = TYPE_ARRAY_ELEMENT;
        (pNVar5->m_enclosingNode).m_ptr = local_40;
        (pNVar5->m_enclosingNode).m_state = local_38;
        if (local_38 != (SharedPtrStateBase *)0x0) {
          LOCK();
          local_38->strongRefCount = local_38->strongRefCount + 1;
          UNLOCK();
          LOCK();
          pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + 1;
          UNLOCK();
        }
        pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
        *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
        local_78.m_ptr = pNVar5;
        pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
        pSVar6->strongRefCount = 0;
        pSVar6->weakRefCount = 0;
        pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
        pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
        pSVar6->strongRefCount = 1;
        pSVar6->weakRefCount = 1;
        local_78.m_state = pSVar6;
        pNVar7 = (Node *)operator_new(0x28);
        pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
        pNVar7->m_type = TYPE_VARIABLE;
        (pNVar7->m_enclosingNode).m_ptr = pNVar5;
        (pNVar7->m_enclosingNode).m_state = pSVar6;
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
        *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
        local_88.m_ptr = pNVar7;
        local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_88.m_state)->strongRefCount = 0;
        (local_88.m_state)->weakRefCount = 0;
        (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
        local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
        (local_88.m_state)->strongRefCount = 1;
        (local_88.m_state)->weakRefCount = 1;
        (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
        goto LAB_0157518b;
      }
      if (SVar4 != SHADERTYPE_TESSELLATION_EVALUATION) goto LAB_01575206;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar5 = parentStructure->m_ptr;
      pSVar6 = parentStructure->m_state;
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_STORAGE_QUALIFIER;
      (pNVar7->m_enclosingNode).m_ptr = pNVar5;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      if (pSVar6 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b368;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 5;
      local_78.m_ptr = pNVar7;
      local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_78.m_state)->strongRefCount = 0;
      (local_78.m_state)->weakRefCount = 0;
      (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      (local_78.m_state)->strongRefCount = 1;
      (local_78.m_state)->weakRefCount = 1;
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_40;
      (pNVar5->m_enclosingNode).m_state = local_38;
      if (local_38 != (SharedPtrStateBase *)0x0) {
        LOCK();
        local_38->strongRefCount = local_38->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xfffffffe;
      local_88.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_88.m_state = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_VARIABLE;
      (pNVar7->m_enclosingNode).m_ptr = pNVar5;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar7;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pSVar6 = local_88.m_state;
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
        }
        LOCK();
        pdVar1 = &pSVar6->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar5->m_type = TYPE_VARIABLE;
      (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      local_88.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_88.m_state)->strongRefCount = 0;
      (local_88.m_state)->weakRefCount = 0;
      (local_88.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_88.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      (local_88.m_state)->strongRefCount = 1;
      (local_88.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_88,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var");
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar5 = (Node *)operator_new(0x20);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar5->m_type = TYPE_STRUCT_MEMBER;
      (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b498;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_88.m_state = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_VARIABLE;
      (pNVar7->m_enclosingNode).m_ptr = pNVar5;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar7;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_struct");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pSVar6 = local_88.m_state;
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
        }
        LOCK();
        pdVar1 = &pSVar6->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_88.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pNVar5 = (Node *)operator_new(0x28);
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar5->m_type = TYPE_ARRAY_ELEMENT;
      (pNVar5->m_enclosingNode).m_ptr = local_78.m_ptr;
      (pNVar5->m_enclosingNode).m_state = local_78.m_state;
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (local_78.m_state)->strongRefCount = (local_78.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
      pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
      *(undefined4 *)&pNVar5[1]._vptr_Node = 0xffffffff;
      local_88.m_state = (SharedPtrStateBase *)0x0;
      local_88.m_ptr = pNVar5;
      pSVar6 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar6->strongRefCount = 0;
      pSVar6->weakRefCount = 0;
      pSVar6->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      pSVar6[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
      pSVar6->strongRefCount = 1;
      pSVar6->weakRefCount = 1;
      local_88.m_state = pSVar6;
      pNVar7 = (Node *)operator_new(0x28);
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
      pNVar7->m_type = TYPE_VARIABLE;
      (pNVar7->m_enclosingNode).m_ptr = pNVar5;
      (pNVar7->m_enclosingNode).m_state = pSVar6;
      LOCK();
      pSVar6->strongRefCount = pSVar6->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar7->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      pNVar7->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
      *(undefined4 *)&pNVar7[1]._vptr_Node = 4;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar7;
      local_68.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_68.m_state)->strongRefCount = 0;
      (local_68.m_state)->weakRefCount = 0;
      (local_68.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
      local_68.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar7;
      (local_68.m_state)->strongRefCount = 1;
      (local_68.m_state)->weakRefCount = 1;
      (*local_48)(local_58,&local_68,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"patch_var_array");
      if (local_68.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_68.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_68.m_ptr = (Node *)0x0;
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_68.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) && (local_68.m_state != (SharedPtrStateBase *)0x0)) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
      }
      pSVar6 = local_88.m_state;
      if (local_88.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.m_ptr = (Node *)0x0;
          (*(local_88.m_state)->_vptr_SharedPtrStateBase[2])(local_88.m_state);
        }
        LOCK();
        pdVar1 = &pSVar6->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        iVar2 = *pdVar1;
        UNLOCK();
        goto joined_r0x015751b7;
      }
      goto LAB_015751c9;
    }
    pNVar5 = (Node *)operator_new(0x28);
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
    pNVar5->m_type = TYPE_VARIABLE;
    (pNVar5->m_enclosingNode).m_ptr = local_40;
    (pNVar5->m_enclosingNode).m_state = local_38;
    if (local_38 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_38->strongRefCount = local_38->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
    pNVar5->_vptr_Node = (_func_int **)&PTR__Node_0216b410;
    *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
    local_78.m_ptr = pNVar5;
    local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
    (local_78.m_state)->strongRefCount = 0;
    (local_78.m_state)->weakRefCount = 0;
    (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
    local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
    (local_78.m_state)->strongRefCount = 1;
    (local_78.m_state)->weakRefCount = 1;
    (*local_48)(local_58,&local_78,local_50,PROGRAMINTERFACE_PROGRAM_INPUT,"var");
    if (local_78.m_state == (SharedPtrStateBase *)0x0) goto LAB_01575206;
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    iVar2 = *pdVar1;
    UNLOCK();
  }
  if ((iVar2 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
  }
LAB_01575206:
  pSVar6 = local_38;
  if (local_38 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_38->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40 = (Node *)0x0;
      (*local_38->_vptr_SharedPtrStateBase[2])(local_38);
    }
    LOCK();
    pdVar1 = &pSVar6->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_38 != (SharedPtrStateBase *)0x0)) {
      (*local_38->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

static void generateProgramInputBlockContents (Context&										context,
											   const ResourceDefinition::Node::SharedPtr&	parentStructure,
											   tcu::TestCaseGroup*							targetGroup,
											   deUint32										presentShadersMask,
											   bool											includeEmpty,
											   void											(*genCase)(Context&										context,
																									   const ResourceDefinition::Node::SharedPtr&	parentStructure,
																									   tcu::TestCaseGroup*							targetGroup,
																									   ProgramInterface								interface,
																									   const char*									name))
{
	const bool									inDefaultBlock	= parentStructure->getType() == ResourceDefinition::Node::TYPE_DEFAULT_BLOCK;
	const ResourceDefinition::Node::SharedPtr	input			= (inDefaultBlock)
																	? (ResourceDefinition::Node::SharedPtr(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_IN)))
																	: (parentStructure);
	const glu::ShaderType						firstStage		= getShaderMaskFirstStage(presentShadersMask);

	// .empty
	if (includeEmpty && inDefaultBlock)
		genCase(context, parentStructure, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "empty");

	if (firstStage == glu::SHADERTYPE_VERTEX)
	{
		// .var
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
		genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
	}
	else if (firstStage == glu::SHADERTYPE_FRAGMENT || !inDefaultBlock)
	{
		// .var
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(input, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// .var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_struct");
		}
		// .var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_CONTROL ||
			 firstStage == glu::SHADERTYPE_GEOMETRY)
	{
		// arrayed interface

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays
	}
	else if (firstStage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		// arrayed interface
		const ResourceDefinition::Node::SharedPtr patchInput(new ResourceDefinition::StorageQualifier(parentStructure, glu::STORAGE_PATCH_IN));

		// .var
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(input, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "var");
		}
		// extension forbids use arrays of structs
		// extension forbids use arrays of arrays

		// .patch_var
		{
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(patchInput, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var");
		}
		// .patch_var_struct
		{
			const ResourceDefinition::Node::SharedPtr structMbr	(new ResourceDefinition::StructMember(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(structMbr, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_struct");
		}
		// .patch_var_array
		{
			const ResourceDefinition::Node::SharedPtr arrayElem	(new ResourceDefinition::ArrayElement(patchInput));
			const ResourceDefinition::Node::SharedPtr variable	(new ResourceDefinition::Variable(arrayElem, glu::TYPE_FLOAT_VEC4));
			genCase(context, variable, targetGroup, PROGRAMINTERFACE_PROGRAM_INPUT, "patch_var_array");
		}
	}
	else if (firstStage == glu::SHADERTYPE_COMPUTE)
	{
		// nada
	}
	else
		DE_ASSERT(false);
}